

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

void hw_breakpoint_remove(CPUX86State *env,int index)

{
  int iVar1;
  CPUState *cpu;
  CPUState *cs;
  int index_local;
  CPUX86State *env_local;
  
  cpu = env_cpu(env);
  iVar1 = hw_breakpoint_type(env->dr[7],index);
  switch(iVar1) {
  case 0:
    if (env->dr[(long)index + 8] != 0) {
      cpu_breakpoint_remove_by_ref_x86_64(cpu,(CPUBreakpoint *)env->dr[(long)index + 8]);
      env->dr[(long)index + 8] = 0;
    }
    break;
  case 1:
  case 3:
    if (env->dr[(long)index + 8] != 0) {
      cpu_watchpoint_remove_by_ref_x86_64(cpu,(CPUWatchpoint *)env->dr[(long)index + 8]);
      env->dr[(long)index + 8] = 0;
    }
    break;
  case 2:
  }
  return;
}

Assistant:

static void hw_breakpoint_remove(CPUX86State *env, int index)
{
    CPUState *cs = env_cpu(env);

    switch (hw_breakpoint_type(env->dr[7], index)) {
    case DR7_TYPE_BP_INST:
        if (env->cpu_breakpoint[index]) {
            cpu_breakpoint_remove_by_ref(cs, env->cpu_breakpoint[index]);
            env->cpu_breakpoint[index] = NULL;
        }
        break;

    case DR7_TYPE_DATA_WR:
    case DR7_TYPE_DATA_RW:
        if (env->cpu_breakpoint[index]) {
            cpu_watchpoint_remove_by_ref(cs, env->cpu_watchpoint[index]);
            env->cpu_breakpoint[index] = NULL;
        }
        break;

    case DR7_TYPE_IO_RW:
        /* HF_IOBPT_MASK cleared elsewhere.  */
        break;
    }
}